

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O3

bool __thiscall QSQLiteResult::exec(QSQLiteResult *this)

{
  uint *puVar1;
  char *pcVar2;
  QSQLiteResultPrivate *this_00;
  QString *pQVar3;
  sqlite3_stmt *psVar4;
  long lVar5;
  double rValue;
  ulong uVar6;
  char cVar7;
  byte bVar8;
  int iVar9;
  long *plVar10;
  sqlite_int64 iValue;
  char *pcVar11;
  undefined8 *puVar12;
  QVariant *pQVar13;
  ulong uVar14;
  long lVar15;
  int i;
  PrivateShared *pPVar16;
  int iVar17;
  storage_type_conflict *psVar18;
  long lVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  bool bVar21;
  QStringView QVar22;
  QByteArrayView QVar23;
  QTime time;
  QList<int> local_c0;
  QString local_a8;
  undefined1 local_88 [32];
  QArrayDataPointer<QVariant> local_68;
  QArrayDataPointer<QVariant> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSQLiteResultPrivate **)&this->field_0x8;
  plVar10 = (long *)QSqlResult::boundValues();
  local_50.d = (Data *)*plVar10;
  local_50.ptr = (QVariant *)plVar10[1];
  local_50.size = plVar10[2];
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_00->skippedStatus = false;
  this_00->skipRow = false;
  QSqlRecord::clear();
  QSqlCachedResult::clearValues();
  local_68.size = 0;
  local_68.d = (Data *)0x0;
  local_68.ptr = (QVariant *)0x0;
  local_88._16_8_ = (CollSeq *)0x0;
  local_88._0_8_ = (sqlite3_vfs *)0x0;
  local_88._8_8_ = (Vdbe *)0x0;
  local_a8.d.size = 0;
  local_a8.d.d = (Data *)0x0;
  local_a8.d.ptr = (char16_t *)0x0;
  QSqlError::QSqlError
            ((QSqlError *)&local_c0,(QString *)(local_88 + 0x20),(QString *)local_88,NoError,
             &local_a8);
  (**(code **)(*(long *)this + 0x28))(this,(QSqlError *)&local_c0);
  QSqlError::~QSqlError((QSqlError *)&local_c0);
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((sqlite3_vfs *)local_88._0_8_ != (sqlite3_vfs *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
  if ((Db *)local_68.d != (Db *)0x0) {
    LOCK();
    ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d)->super_QArrayData,2,0x10);
    }
  }
  iVar9 = sqlite3_reset(this_00->stmt);
  if (iVar9 == 0) {
    iVar9 = sqlite3_bind_parameter_count(this_00->stmt);
    uVar20 = (ulong)iVar9;
    if ((long)uVar20 < local_50.size && 0 < iVar9) {
      lVar15 = *(long *)&(this_00->super_QSqlCachedResultPrivate).field_0x78;
      if (lVar15 == 0) {
        lVar15 = 0;
        uVar14 = 0;
LAB_00113d48:
        if (lVar15 != 0 || uVar14 != 0) goto LAB_00113d50;
        uVar14 = 0;
      }
      else {
        if (**(char **)(lVar15 + 0x20) == -1) {
          uVar6 = 1;
          do {
            uVar14 = uVar6;
            if (*(ulong *)(lVar15 + 0x10) == uVar14) {
              lVar15 = 0;
              uVar14 = 0;
              break;
            }
            uVar6 = uVar14 + 1;
          } while ((*(char **)(lVar15 + 0x20))[(ulong)((uint)uVar14 & 0x7f) + (uVar14 >> 7) * 0x90]
                   == -1);
          goto LAB_00113d48;
        }
        uVar14 = 0;
LAB_00113d50:
        iVar17 = 0;
        do {
          lVar5 = *(long *)(lVar15 + 0x20);
          lVar19 = (uVar14 >> 7) * 0x90;
          iVar17 = iVar17 + *(int *)(*(long *)(lVar5 + 0x80 + lVar19) + 0x28 +
                                    (ulong)((uint)*(byte *)((ulong)((uint)uVar14 & 0x7f) +
                                                           lVar5 + lVar19) * 0x30));
          do {
            if (*(long *)(lVar15 + 0x10) - 1U == uVar14) {
              uVar14 = 0;
              lVar15 = 0;
              break;
            }
            uVar14 = uVar14 + 1;
          } while (*(char *)((ulong)((uint)uVar14 & 0x7f) + (uVar14 >> 7) * 0x90 + lVar5) == -1);
        } while ((uVar14 != 0) || (lVar15 != 0));
        uVar14 = (ulong)iVar17;
      }
      bVar21 = local_50.size == uVar14;
      local_68.d = (Data *)0x0;
      local_68.ptr = (QVariant *)0x0;
      uVar14 = 0;
      local_68.size = 0;
      local_88._16_8_ = (CollSeq *)0x0;
      local_88._0_8_ = (sqlite3_vfs *)0x0;
      local_88._8_8_ = (Vdbe *)0x0;
      iVar17 = 0;
      do {
        if ((CollSeq *)local_88._16_8_ == (CollSeq *)0x0) {
LAB_00113e3b:
          i = iVar17 + 1;
          pcVar11 = sqlite3_bind_parameter_name(this_00->stmt,i);
          if (pcVar11 == (char *)0x0) {
            bVar21 = false;
          }
          else {
            local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            psVar18 = (storage_type_conflict *)0xffffffffffffffff;
            do {
              pcVar2 = pcVar11 + 1 + (long)psVar18;
              psVar18 = psVar18 + 1;
            } while (*pcVar2 != '\0');
            QVar23.m_data = psVar18;
            QVar23.m_size = (qsizetype)&local_a8;
            QString::fromUtf8(QVar23);
            QHash<QString,_QList<int>_>::value
                      (&local_c0,
                       (QHash<QString,_QList<int>_> *)
                       &(this_00->super_QSqlCachedResultPrivate).field_0x78,&local_a8);
            QtPrivate::QCommonArrayOps<int>::growAppend
                      ((QCommonArrayOps<int> *)local_88,local_c0.d.ptr,
                       local_c0.d.ptr + local_c0.d.size);
            QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant_const&>
                      ((QMovableArrayOps<QVariant> *)(local_88 + 0x20),local_68.size,
                       local_50.ptr + *local_c0.d.ptr);
            QList<QVariant>::end((QList<QVariant> *)(local_88 + 0x20));
            if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,4,0x10);
              }
            }
            iVar17 = i;
            if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
        }
        else {
          lVar15 = 0;
          do {
            if (local_88._16_8_ << 2 == lVar15) goto LAB_00113e3b;
            puVar1 = (uint *)((long)(sqlite3 **)local_88._8_8_ + lVar15);
            lVar15 = lVar15 + 4;
          } while (uVar14 != *puVar1);
          if (lVar15 == 0) goto LAB_00113e3b;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < (ulong)local_50.size);
      QArrayDataPointer<QVariant>::operator=
                (&local_50,(QArrayDataPointer<QVariant> *)(local_88 + 0x20));
      if ((sqlite3_vfs *)local_88._0_8_ != (sqlite3_vfs *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,4,0x10);
        }
      }
      QArrayDataPointer<QVariant>::~QArrayDataPointer
                ((QArrayDataPointer<QVariant> *)(local_88 + 0x20));
      if (bVar21) {
LAB_001138c5:
        if (0 < iVar9) {
          iVar9 = 1;
          lVar15 = 0;
          do {
            pQVar13 = local_50.ptr;
            pPVar16 = (PrivateShared *)((long)&((local_50.ptr)->d).data + lVar15);
            cVar7 = QSqlResultPrivate::isVariantNull((QVariant *)pPVar16);
            if (cVar7 != '\0') {
              iVar17 = sqlite3_bind_null(this_00->stmt,iVar9);
              goto LAB_00113912;
            }
            iVar17 = QVariant::typeId((QVariant *)pPVar16);
            switch(iVar17) {
            case 1:
            case 2:
              psVar4 = this_00->stmt;
              iVar17 = QVariant::toInt((bool *)pPVar16);
              iVar17 = sqlite3_bind_int(psVar4,iVar9,iVar17);
              break;
            case 3:
            case 4:
              psVar4 = this_00->stmt;
              iValue = QVariant::toLongLong((bool *)pPVar16);
              iVar17 = sqlite3_bind_int64(psVar4,iVar9,iValue);
              break;
            default:
              local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_68.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
              QVariant::toString();
              goto LAB_00113b96;
            case 6:
              psVar4 = this_00->stmt;
              rValue = (double)QVariant::toDouble((bool *)pPVar16);
              iVar17 = sqlite3_bind_double(psVar4,iVar9,rValue);
              break;
            case 10:
              if (((&(pQVar13->d).field_0x18)[lVar15] & 1) != 0) {
                pPVar16 = (PrivateShared *)
                          ((long)*(int *)(*(long *)&pPVar16->field_0x0 + 4) +
                          *(long *)&pPVar16->field_0x0);
              }
              puVar12 = *(undefined8 **)((long)&(((QVariant *)pPVar16)->d).data + 8);
              if (puVar12 == (undefined8 *)0x0) {
                puVar12 = &QString::_empty;
              }
              iVar17 = sqlite3_bind_text16(this_00->stmt,iVar9,puVar12,
                                           *(int *)((long)&(((QVariant *)pPVar16)->d).data + 0x10) *
                                           2,(_func_void_void_ptr *)0x0);
              break;
            case 0xc:
              if (((&(pQVar13->d).field_0x18)[lVar15] & 1) != 0) {
                pPVar16 = (((Private *)&pPVar16->field_0x0)->data).shared;
                pPVar16 = pPVar16 + *(int *)(pPVar16 + 4);
              }
              puVar12 = *(undefined8 **)&pPVar16[8].field_0x0;
              if (puVar12 == (undefined8 *)0x0) {
                puVar12 = &QByteArray::_empty;
              }
              iVar17 = sqlite3_bind_blob(this_00->stmt,iVar9,puVar12,
                                         *(int *)&pPVar16[0x10].field_0x0,(_func_void_void_ptr *)0x0
                                        );
              break;
            case 0xf:
              local_88._0_4_ = 0xaaaaaaaa;
              local_88._0_4_ = QVariant::toTime();
              local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_68.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
              QVar22.m_data = (storage_type *)local_88;
              QVar22.m_size = (qsizetype)(local_88 + 0x20);
              QTime::toString(QVar22);
LAB_00113b96:
              pQVar13 = local_68.ptr;
              if (local_68.ptr == (QVariant *)0x0) {
                pQVar13 = (QVariant *)&QString::_empty;
              }
              iVar17 = sqlite3_bind_text16(this_00->stmt,iVar9,pQVar13,(int)local_68.size * 2,
                                           (_func_void_void_ptr *)0xffffffffffffffff);
              if ((Db *)local_68.d != (Db *)0x0) {
                LOCK();
                ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_68.d)->super_QArrayData,2,0x10);
                }
              }
              break;
            case 0x10:
              local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              QVariant::toDateTime();
              local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_68.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
              QDateTime::toString((int)local_88 + 0x20);
              pQVar13 = local_68.ptr;
              if (local_68.ptr == (QVariant *)0x0) {
                pQVar13 = (QVariant *)&QString::_empty;
              }
              iVar17 = sqlite3_bind_text16(this_00->stmt,iVar9,pQVar13,(int)local_68.size * 2,
                                           (_func_void_void_ptr *)0xffffffffffffffff);
              if ((Db *)local_68.d != (Db *)0x0) {
                LOCK();
                ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_68.d)->super_QArrayData,2,0x10);
                }
              }
              QDateTime::~QDateTime((QDateTime *)local_88);
            }
LAB_00113912:
            if (iVar17 != 0) {
              pQVar3 = *(QString **)
                        (*(long *)(*(long *)&(this_00->super_QSqlCachedResultPrivate).field_0x18 + 8
                                  ) + 0xa8);
              QCoreApplication::translate
                        (local_88 + 0x20,"QSQLiteResult","Unable to bind parameters",0);
              qMakeError((sqlite3 *)local_88,pQVar3,(ErrorType)(local_88 + 0x20),2);
              lVar15 = *(long *)this;
              goto LAB_001137d3;
            }
            iVar9 = iVar9 + 1;
            lVar15 = lVar15 + 0x20;
          } while (uVar20 << 5 != lVar15);
        }
        bVar21 = QSQLiteResultPrivate::fetchNext(this_00,&this_00->firstRow,0,true);
        this_00->skippedStatus = bVar21;
        QSqlResult::lastError();
        cVar7 = QSqlError::isValid();
        QSqlError::~QSqlError((QSqlError *)(local_88 + 0x20));
        if (cVar7 == '\0') {
          bVar8 = QSqlRecord::isEmpty();
          (**(code **)(*(long *)this + 0x38))(this,bVar8 ^ 1);
          (**(code **)(*(long *)this + 0x20))(this,1);
          bVar21 = true;
        }
        else {
          bVar21 = false;
          (**(code **)(*(long *)this + 0x38))(this,0);
          (**(code **)(*(long *)this + 0x20))(this,0);
        }
        goto LAB_00113824;
      }
    }
    else if (local_50.size == uVar20) goto LAB_001138c5;
    QCoreApplication::translate
              ((char *)(local_88 + 0x20),"QSQLiteResult","Parameter count mismatch",0);
    local_88._16_8_ = (CollSeq *)0x0;
    local_88._0_8_ = (sqlite3_vfs *)0x0;
    local_88._8_8_ = (Vdbe *)0x0;
    local_a8.d.size = 0;
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (char16_t *)0x0;
    QSqlError::QSqlError
              ((QSqlError *)&local_c0,(QString *)(local_88 + 0x20),(QString *)local_88,
               StatementError,&local_a8);
    (**(code **)(*(long *)this + 0x28))(this,(QSqlError *)&local_c0);
    QSqlError::~QSqlError((QSqlError *)&local_c0);
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((sqlite3_vfs *)local_88._0_8_ != (sqlite3_vfs *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    if ((Db *)local_68.d != (Db *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    pQVar3 = *(QString **)
              (*(long *)(*(long *)&(this_00->super_QSqlCachedResultPrivate).field_0x18 + 8) + 0xa8);
    QCoreApplication::translate(local_88 + 0x20,"QSQLiteResult","Unable to reset statement",0);
    qMakeError((sqlite3 *)local_88,pQVar3,(ErrorType)(local_88 + 0x20),2);
    lVar15 = *(long *)this;
LAB_001137d3:
    (**(code **)(lVar15 + 0x28))(this,(QSqlError *)local_88);
    QSqlError::~QSqlError((QSqlError *)local_88);
    if ((Db *)local_68.d != (Db *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d)->super_QArrayData,2,0x10);
      }
    }
    if (this_00->stmt != (sqlite3_stmt *)0x0) {
      sqlite3_finalize(this_00->stmt);
      this_00->stmt = (sqlite3_stmt *)0x0;
    }
  }
  bVar21 = false;
LAB_00113824:
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar21;
  }
  __stack_chk_fail();
}

Assistant:

bool QSQLiteResult::exec()
{
    Q_D(QSQLiteResult);
    QList<QVariant> values = boundValues();

    d->skippedStatus = false;
    d->skipRow = false;
    d->rInf.clear();
    clearValues();
    setLastError(QSqlError());

    int res = sqlite3_reset(d->stmt);
    if (res != SQLITE_OK) {
        setLastError(qMakeError(d->drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
                     "Unable to reset statement"), QSqlError::StatementError, res));
        d->finalize();
        return false;
    }

    int paramCount = sqlite3_bind_parameter_count(d->stmt);
    bool paramCountIsValid = paramCount == values.size();

#if (SQLITE_VERSION_NUMBER >= 3003011)
    // In the case of the reuse of a named placeholder
    // We need to check explicitly that paramCount is greater than or equal to 1, as sqlite
    // can end up in a case where for virtual tables it returns 0 even though it
    // has parameters
    if (paramCount >= 1 && paramCount < values.size()) {
        const auto countIndexes = [](int counter, const QList<int> &indexList) {
                                      return counter + indexList.size();
                                  };

        const int bindParamCount = std::accumulate(d->indexes.cbegin(),
                                                   d->indexes.cend(),
                                                   0,
                                                   countIndexes);

        paramCountIsValid = bindParamCount == values.size();
        // When using named placeholders, it will reuse the index for duplicated
        // placeholders. So we need to ensure the QList has only one instance of
        // each value as SQLite will do the rest for us.
        QList<QVariant> prunedValues;
        QList<int> handledIndexes;
        for (int i = 0, currentIndex = 0; i < values.size(); ++i) {
            if (handledIndexes.contains(i))
                continue;
            const char *parameterName = sqlite3_bind_parameter_name(d->stmt, currentIndex + 1);
            if (!parameterName) {
                paramCountIsValid = false;
                continue;
            }
            const auto placeHolder = QString::fromUtf8(parameterName);
            const auto &indexes = d->indexes.value(placeHolder);
            handledIndexes << indexes;
            prunedValues << values.at(indexes.first());
            ++currentIndex;
        }
        values = prunedValues;
    }
#endif

    if (paramCountIsValid) {
        for (int i = 0; i < paramCount; ++i) {
            res = SQLITE_OK;
            const QVariant &value = values.at(i);

            if (QSqlResultPrivate::isVariantNull(value)) {
                res = sqlite3_bind_null(d->stmt, i + 1);
            } else {
                switch (value.userType()) {
                case QMetaType::QByteArray: {
                    const QByteArray *ba = static_cast<const QByteArray*>(value.constData());
                    res = sqlite3_bind_blob(d->stmt, i + 1, ba->constData(),
                                            ba->size(), SQLITE_STATIC);
                    break; }
                case QMetaType::Int:
                case QMetaType::Bool:
                    res = sqlite3_bind_int(d->stmt, i + 1, value.toInt());
                    break;
                case QMetaType::Double:
                    res = sqlite3_bind_double(d->stmt, i + 1, value.toDouble());
                    break;
                case QMetaType::UInt:
                case QMetaType::LongLong:
                    res = sqlite3_bind_int64(d->stmt, i + 1, value.toLongLong());
                    break;
                case QMetaType::QDateTime: {
                    const QDateTime dateTime = value.toDateTime();
                    const QString str = dateTime.toString(Qt::ISODateWithMs);
                    res = sqlite3_bind_text16(d->stmt, i + 1, str.data(),
                                              int(str.size() * sizeof(ushort)),
                                              SQLITE_TRANSIENT);
                    break;
                }
                case QMetaType::QTime: {
                    const QTime time = value.toTime();
                    const QString str = time.toString(u"hh:mm:ss.zzz");
                    res = sqlite3_bind_text16(d->stmt, i + 1, str.data(),
                                              int(str.size() * sizeof(ushort)),
                                              SQLITE_TRANSIENT);
                    break;
                }
                case QMetaType::QString: {
                    // lifetime of string == lifetime of its qvariant
                    const QString *str = static_cast<const QString*>(value.constData());
                    res = sqlite3_bind_text16(d->stmt, i + 1, str->unicode(),
                                              int(str->size()) * sizeof(QChar),
                                              SQLITE_STATIC);
                    break; }
                default: {
                    const QString str = value.toString();
                    // SQLITE_TRANSIENT makes sure that sqlite buffers the data
                    res = sqlite3_bind_text16(d->stmt, i + 1, str.data(),
                                              int(str.size()) * sizeof(QChar),
                                              SQLITE_TRANSIENT);
                    break; }
                }
            }
            if (res != SQLITE_OK) {
                setLastError(qMakeError(d->drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
                             "Unable to bind parameters"), QSqlError::StatementError, res));
                d->finalize();
                return false;
            }
        }
    } else {
        setLastError(QSqlError(QCoreApplication::translate("QSQLiteResult",
                        "Parameter count mismatch"), QString(), QSqlError::StatementError));
        return false;
    }
    d->skippedStatus = d->fetchNext(d->firstRow, 0, true);
    if (lastError().isValid()) {
        setSelect(false);
        setActive(false);
        return false;
    }
    setSelect(!d->rInf.isEmpty());
    setActive(true);
    return true;
}